

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_loadbangsubpatches(_glist *x)

{
  _glist *x_00;
  t_gobj *x_01;
  t_symbol *s;
  t_gotfn p_Var1;
  t_gobj **pptVar2;
  t_gobj **pptVar3;
  
  s = gensym("loadbang");
  pptVar2 = &x->gl_list;
  pptVar3 = pptVar2;
  while (x_00 = (_glist *)*pptVar3, x_00 != (_glist *)0x0) {
    if (((x_00->gl_obj).te_g.g_pd == canvas_class) && (x_00->gl_env == (_canvasenvironment *)0x0)) {
      canvas_loadbangsubpatches(x_00);
    }
    pptVar3 = &(x_00->gl_obj).te_g.g_next;
  }
  while (x_01 = *pptVar2, x_01 != (t_gobj *)0x0) {
    if (((x_01->g_pd != canvas_class) && (x_01->g_pd != clone_class)) &&
       (p_Var1 = zgetfn(&x_01->g_pd,s), p_Var1 != (t_gotfn)0x0)) {
      pd_vmess(&x_01->g_pd,s,"f",0);
    }
    pptVar2 = &x_01->g_next;
  }
  return;
}

Assistant:

void canvas_loadbangsubpatches(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");
    for (y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == canvas_class)
        {
            if (!canvas_isabstraction((t_canvas *)y))
                canvas_loadbangsubpatches((t_canvas *)y);
        }
    for (y = x->gl_list; y; y = y->g_next)
        if ((pd_class(&y->g_pd) != canvas_class) &&
            (pd_class(&y->g_pd) != clone_class) &&
            zgetfn(&y->g_pd, s))
        {
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_LOAD);
        }
}